

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usprep.cpp
# Opt level: O1

int32_t usprep_map(UStringPrepProfile *profile,UChar *src,int32_t srcLength,UChar *dest,
                  int32_t destCapacity,int32_t options,UParseError *parseError,UErrorCode *status)

{
  uint16_t *puVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  int32_t iVar6;
  short sVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  
  if (srcLength < 1) {
    iVar6 = 0;
  }
  else {
    uVar14 = 0;
    iVar12 = 0;
    do {
      iVar13 = (int)uVar14;
      iVar4 = iVar12 + 1;
      uVar11 = (uint)(ushort)src[iVar12];
      if ((iVar4 != srcLength && (uVar11 & 0xfc00) == 0xd800) &&
         (((ushort)src[iVar4] & 0xfc00) == 0xdc00)) {
        uVar11 = (uint)(ushort)src[iVar12] * 0x400 + (uint)(ushort)src[iVar4] + 0xfca02400;
        iVar4 = iVar12 + 2;
      }
      iVar12 = iVar4;
      if (uVar11 < 0x10000) {
        puVar1 = (profile->sprepTrie).index;
        uVar5 = (uVar11 >> 5) + 0x140;
        if ((uVar11 & 0xfc00) != 0xd800) {
          uVar5 = uVar11 >> 5;
        }
        uVar5 = (uint)puVar1[(uVar11 & 0x1f) + (uint)puVar1[uVar5] * 4];
      }
      else if (uVar11 < 0x110000) {
        puVar1 = (profile->sprepTrie).index;
        iVar6 = (*(profile->sprepTrie).getFoldingOffset)
                          ((uint32_t)
                           puVar1[(uVar11 >> 10 & 0x1f) +
                                  (uint)puVar1[(uVar11 >> 10) + 0xd7c0 >> 5] * 4]);
        if (iVar6 < 1) {
          uVar3 = (ushort)(profile->sprepTrie).initialValue;
        }
        else {
          puVar1 = (profile->sprepTrie).index;
          uVar3 = puVar1[(uVar11 & 0x1f) + (uint)puVar1[iVar6 + (uVar11 >> 5 & 0x1f)] * 4];
        }
        uVar5 = (uint)uVar3;
      }
      else {
        uVar5 = (uint)(ushort)(profile->sprepTrie).initialValue;
      }
      uVar3 = (ushort)uVar5;
      if (uVar3 == 0) {
        iVar4 = 4;
LAB_00301a3f:
        sVar7 = 0;
        cVar2 = '\0';
      }
      else {
        if (0xffef < uVar3) {
          iVar4 = uVar5 - 0xfff0;
          goto LAB_00301a3f;
        }
        sVar7 = (short)(uVar5 >> 2);
        if ((uVar5 & 2) == 0) {
          sVar7 = (short)uVar3 >> 2;
        }
        if ((uVar5 & 0xfffffffc) == 0xfefc) {
          iVar4 = 3;
          goto LAB_00301a3f;
        }
        cVar2 = (char)((uVar5 & 2) >> 1);
        iVar4 = 1;
      }
      if (iVar4 == 0 && (options & 1U) == 0) {
        uprv_syntaxError_63(src,(uVar11 < 0x10000 | 0xfffffffe) + iVar12,srcLength,parseError);
        *status = U_IDNA_UNASSIGNED_ERROR;
        iVar4 = 1;
      }
      else if (iVar4 != 3) {
        if (iVar4 == 1) {
          iVar8 = (int)sVar7;
          if (cVar2 == '\0') {
            uVar11 = uVar11 - iVar8;
            iVar4 = 0;
          }
          else {
            if ((((iVar8 < profile->indexes[3]) || (uVar5 = 1, profile->indexes[4] <= iVar8)) &&
                ((iVar8 < profile->indexes[4] || (uVar5 = 2, profile->indexes[5] <= iVar8)))) &&
               ((iVar8 < profile->indexes[5] || (uVar5 = 3, profile->indexes[6] <= iVar8)))) {
              iVar8 = iVar8 + 1;
              uVar5 = (uint)profile->mappingData[sVar7];
            }
            iVar4 = 3;
            if (uVar5 != 0) {
              lVar9 = (long)iVar8;
              uVar14 = (ulong)iVar13;
              uVar10 = (ulong)uVar5;
              do {
                if ((long)uVar14 < (long)destCapacity) {
                  dest[uVar14] = profile->mappingData[lVar9];
                }
                uVar14 = uVar14 + 1;
                lVar9 = lVar9 + 1;
                uVar10 = uVar10 - 1;
              } while (uVar10 != 0);
            }
          }
          iVar13 = (int)uVar14;
          if (cVar2 != '\0') goto LAB_00301b7e;
        }
        if ((int)uVar11 < 0x10000) {
          if (iVar13 < destCapacity) {
            dest[iVar13] = (UChar)uVar11;
          }
          uVar11 = iVar13 + 1;
        }
        else {
          if (iVar13 + 1 < destCapacity) {
            dest[iVar13] = (short)(uVar11 >> 10) + L'ퟀ';
            dest[iVar13 + 1] = (UChar)uVar11 & 0x3ffU | 0xdc00;
          }
          uVar11 = iVar13 + 2;
        }
        uVar14 = (ulong)uVar11;
        iVar4 = 0;
      }
LAB_00301b7e:
      iVar6 = (int32_t)uVar14;
      if ((iVar4 != 3) && (iVar4 != 0)) {
        return 0;
      }
    } while (iVar12 < srcLength);
  }
  iVar6 = u_terminateUChars_63(dest,destCapacity,iVar6,status);
  return iVar6;
}

Assistant:

static int32_t 
usprep_map(  const UStringPrepProfile* profile, 
             const UChar* src, int32_t srcLength, 
             UChar* dest, int32_t destCapacity,
             int32_t options,
             UParseError* parseError,
             UErrorCode* status ){
    
    uint16_t result;
    int32_t destIndex=0;
    int32_t srcIndex;
    UBool allowUnassigned = (UBool) ((options & USPREP_ALLOW_UNASSIGNED)>0);
    UStringPrepType type;
    int16_t value;
    UBool isIndex;
    const int32_t* indexes = profile->indexes;

    // no error checking the caller check for error and arguments
    // no string length check the caller finds out the string length

    for(srcIndex=0;srcIndex<srcLength;){
        UChar32 ch;

        U16_NEXT(src,srcIndex,srcLength,ch);
        
        result=0;

        UTRIE_GET16(&profile->sprepTrie,ch,result);
        
        type = getValues(result, value, isIndex);

        // check if the source codepoint is unassigned
        if(type == USPREP_UNASSIGNED && allowUnassigned == FALSE){

            uprv_syntaxError(src,srcIndex-U16_LENGTH(ch), srcLength,parseError);
            *status = U_STRINGPREP_UNASSIGNED_ERROR;
            return 0;
            
        }else if(type == USPREP_MAP){
            
            int32_t index, length;

            if(isIndex){
                index = value;
                if(index >= indexes[_SPREP_ONE_UCHAR_MAPPING_INDEX_START] &&
                         index < indexes[_SPREP_TWO_UCHARS_MAPPING_INDEX_START]){
                    length = 1;
                }else if(index >= indexes[_SPREP_TWO_UCHARS_MAPPING_INDEX_START] &&
                         index < indexes[_SPREP_THREE_UCHARS_MAPPING_INDEX_START]){
                    length = 2;
                }else if(index >= indexes[_SPREP_THREE_UCHARS_MAPPING_INDEX_START] &&
                         index < indexes[_SPREP_FOUR_UCHARS_MAPPING_INDEX_START]){
                    length = 3;
                }else{
                    length = profile->mappingData[index++];
         
                }

                /* copy mapping to destination */
                for(int32_t i=0; i< length; i++){
                    if(destIndex < destCapacity  ){
                        dest[destIndex] = profile->mappingData[index+i];
                    }
                    destIndex++; /* for pre-flighting */
                }  
                continue;
            }else{
                // subtract the delta to arrive at the code point
                ch -= value;
            }

        }else if(type==USPREP_DELETE){
             // just consume the codepoint and contine
            continue;
        }
        //copy the code point into destination
        if(ch <= 0xFFFF){
            if(destIndex < destCapacity ){
                dest[destIndex] = (UChar)ch;
            }
            destIndex++;
        }else{
            if(destIndex+1 < destCapacity ){
                dest[destIndex]   = U16_LEAD(ch);
                dest[destIndex+1] = U16_TRAIL(ch);
            }
            destIndex +=2;
        }
       
    }
        
    return u_terminateUChars(dest, destCapacity, destIndex, status);
}